

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  Size *pSVar1;
  int *piVar2;
  int **ppiVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  byte *pbVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  Mat alp;
  SharedMatting sm;
  Mat b_k;
  Mat src;
  Mat element;
  Rect ccomp;
  Mat element_e;
  Mat trimap;
  Mat dil;
  Mat ero;
  Mat can;
  Mat can2;
  Mat can1;
  Mat out;
  undefined8 in_stack_fffffffffffff818;
  undefined4 uVar11;
  long *local_7d8;
  _InputArray *local_7d0;
  long local_7c8 [2];
  void *local_7b8;
  undefined8 uStack_7b0;
  long local_7a8;
  _OutputArray local_798 [3];
  long *local_750;
  _InputArray local_730;
  undefined1 local_718 [8];
  void *pvStack_710;
  Size SStack_708;
  undefined8 uStack_700;
  _InputArray local_570 [3];
  long *local_528;
  ulong local_510;
  ulong local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  string local_468 [8];
  int local_460;
  uint local_45c;
  long local_458;
  ulong *local_428;
  long *local_420;
  _InputArray local_408 [4];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  _OutputArray local_398 [4];
  Mat local_338 [96];
  Mat local_2d8 [96];
  Mat local_278 [96];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  Mat local_1b0 [96];
  Mat local_150 [96];
  Mat local_f0 [96];
  Mat local_90 [96];
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffff818 >> 0x20);
  local_718 = (undefined1  [8])&SStack_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"input/lady1.jpg","");
  cv::imread(local_468,(int)local_718);
  if (local_718 != (undefined1  [8])&SStack_708) {
    operator_delete((void *)local_718,(long)SStack_708 + 1);
  }
  cv::Mat::Mat(local_90);
  cv::Mat::Mat(local_f0);
  cv::Mat::Mat(local_150);
  cv::Mat::Mat(local_1b0);
  cv::Mat::Mat(local_278);
  cv::Mat::Mat(local_2d8);
  cv::Mat::Mat(local_338);
  SStack_708.width = 0;
  SStack_708.height = 0;
  local_718._0_4_ = 0x1010000;
  pvStack_710 = local_468;
  local_408[0].sz.width = 0;
  local_408[0].sz.height = 0;
  local_408[0].flags = 0x2010000;
  local_470 = 0xa0000000a;
  local_478 = 0xffffffffffffffff;
  local_408[0].obj = local_90;
  cv::boxFilter(local_718,local_408,0xffffffff,&local_470,&local_478,1,CONCAT44(uVar11,4));
  SStack_708.width = 0;
  SStack_708.height = 0;
  local_718._0_4_ = 0x1010000;
  local_408[0].sz.width = 0;
  local_408[0].sz.height = 0;
  local_408[0].flags = 0x2010000;
  pvStack_710 = local_90;
  local_408[0].obj = local_f0;
  cv::Canny((_InputArray *)local_718,(_OutputArray *)local_408,36.0,36.0,3,false);
  local_3a8 = 0;
  uStack_3a0 = 0;
  SStack_708.width = 0;
  SStack_708.height = 0;
  local_718._0_4_ = 0x3010000;
  local_480 = 0xa0000000a;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1f8 = 0x4008000000000000;
  uStack_1f0 = 0x4008000000000000;
  local_1e8 = 0x4008000000000000;
  uStack_1e0 = 0;
  local_218 = 0x4008000000000000;
  uStack_210 = 0x4008000000000000;
  local_208 = 0x4008000000000000;
  uStack_200 = 0;
  pvStack_710 = local_90;
  cv::floodFill();
  SStack_708.width = 0;
  SStack_708.height = 0;
  local_718._0_4_ = 0x1010000;
  local_408[0].sz.width = 0;
  local_408[0].sz.height = 0;
  local_408[0].flags = 0x2010000;
  pvStack_710 = local_90;
  local_408[0].obj = local_150;
  cv::Canny((_InputArray *)local_718,(_OutputArray *)local_408,15.0,15.0,3,false);
  SStack_708.width = 0;
  SStack_708.height = 0;
  local_718._0_4_ = 0x1010000;
  local_408[0].sz.width = 0;
  local_408[0].sz.height = 0;
  local_408[0].flags = 0x1010000;
  local_398[0].super__InputArray.sz.width = 0;
  local_398[0].super__InputArray.sz.height = 0;
  local_398[0].super__InputArray.flags = 0x2010000;
  pvStack_710 = local_f0;
  local_408[0].obj = local_150;
  local_398[0].super__InputArray.obj = local_1b0;
  cv::addWeighted((_InputArray *)local_718,1.0,local_408,1.0,0.0,local_398,-1);
  local_488 = 0x2300000023;
  local_490 = 0xffffffffffffffff;
  cv::getStructuringElement(local_408,2);
  local_498 = 0x3200000032;
  local_4a0 = 0xffffffffffffffff;
  cv::getStructuringElement(local_398,2);
  local_570[0].sz.width = 0;
  local_570[0].sz.height = 0;
  local_570[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_4a8 = 0xffffffffffffffff;
  local_718 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_710 = (void *)0x7fefffffffffffff;
  SStack_708.width = -1;
  SStack_708.height = 0x7fefffff;
  uStack_700 = 0x7fefffffffffffff;
  local_7d0 = &local_398[0].super__InputArray;
  local_798[0].super__InputArray.obj = local_2d8;
  local_570[0].obj = local_1b0;
  cv::dilate();
  local_570[0].sz.width = 0;
  local_570[0].sz.height = 0;
  local_570[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_4b0 = 0xffffffffffffffff;
  local_718 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_710 = (void *)0x7fefffffffffffff;
  SStack_708.width = -1;
  SStack_708.height = 0x7fefffff;
  uStack_700 = 0x7fefffffffffffff;
  local_7d0 = &local_398[0].super__InputArray;
  local_798[0].super__InputArray.obj = local_2d8;
  local_570[0].obj = local_2d8;
  cv::dilate();
  local_570[0].sz.width = 0;
  local_570[0].sz.height = 0;
  local_570[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_4b8 = 0xffffffffffffffff;
  local_718 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_710 = (void *)0x7fefffffffffffff;
  SStack_708.width = -1;
  SStack_708.height = 0x7fefffff;
  uStack_700 = 0x7fefffffffffffff;
  local_7d0 = local_408;
  local_798[0].super__InputArray.obj = local_2d8;
  local_570[0].obj = local_2d8;
  cv::dilate();
  local_570[0].sz.width = 0;
  local_570[0].sz.height = 0;
  local_570[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_4c0 = 0xffffffffffffffff;
  local_718 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_710 = (void *)0x7fefffffffffffff;
  SStack_708.width = -1;
  SStack_708.height = 0x7fefffff;
  uStack_700 = 0x7fefffffffffffff;
  local_7d0 = local_408;
  local_798[0].super__InputArray.obj = local_2d8;
  local_570[0].obj = local_2d8;
  cv::dilate();
  local_570[0].sz.width = 0;
  local_570[0].sz.height = 0;
  local_570[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_4c8 = 0xffffffffffffffff;
  local_718 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_710 = (void *)0x7fefffffffffffff;
  SStack_708.width = -1;
  SStack_708.height = 0x7fefffff;
  uStack_700 = 0x7fefffffffffffff;
  local_7d0 = &local_398[0].super__InputArray;
  local_798[0].super__InputArray.obj = local_278;
  local_570[0].obj = local_2d8;
  cv::erode();
  local_570[0].sz.width = 0;
  local_570[0].sz.height = 0;
  local_570[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_4d0 = 0xffffffffffffffff;
  local_718 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_710 = (void *)0x7fefffffffffffff;
  SStack_708.width = -1;
  SStack_708.height = 0x7fefffff;
  uStack_700 = 0x7fefffffffffffff;
  local_7d0 = &local_398[0].super__InputArray;
  local_798[0].super__InputArray.obj = local_278;
  local_570[0].obj = local_278;
  cv::erode();
  local_570[0].sz.width = 0;
  local_570[0].sz.height = 0;
  local_570[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_4d8 = 0xffffffffffffffff;
  local_718 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_710 = (void *)0x7fefffffffffffff;
  SStack_708.width = -1;
  SStack_708.height = 0x7fefffff;
  uStack_700 = 0x7fefffffffffffff;
  local_7d0 = &local_398[0].super__InputArray;
  local_798[0].super__InputArray.obj = local_278;
  local_570[0].obj = local_278;
  cv::erode();
  local_570[0].sz.width = 0;
  local_570[0].sz.height = 0;
  local_570[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_4e0 = 0xffffffffffffffff;
  local_718 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_710 = (void *)0x7fefffffffffffff;
  SStack_708.width = -1;
  SStack_708.height = 0x7fefffff;
  uStack_700 = 0x7fefffffffffffff;
  local_7d0 = &local_398[0].super__InputArray;
  local_798[0].super__InputArray.obj = local_278;
  local_570[0].obj = local_278;
  cv::erode();
  local_570[0].sz.width = 0;
  local_570[0].sz.height = 0;
  local_570[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8._0_4_ = 0x1010000;
  local_4e8 = 0xffffffffffffffff;
  local_718 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_710 = (void *)0x7fefffffffffffff;
  SStack_708.width = -1;
  SStack_708.height = 0x7fefffff;
  uStack_700 = 0x7fefffffffffffff;
  local_7d0 = local_408;
  local_798[0].super__InputArray.obj = local_278;
  local_570[0].obj = local_278;
  cv::erode();
  local_570[0].sz.width = 0;
  local_570[0].sz.height = 0;
  local_570[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_7c8[0] = 0;
  local_7d8 = (long *)CONCAT44(local_7d8._4_4_,0x1010000);
  local_4f0 = 0xffffffffffffffff;
  local_718 = (undefined1  [8])0x7fefffffffffffff;
  pvStack_710 = (void *)0x7fefffffffffffff;
  SStack_708.width = -1;
  SStack_708.height = 0x7fefffff;
  uStack_700 = 0x7fefffffffffffff;
  local_7d0 = local_408;
  local_798[0].super__InputArray.obj = local_278;
  local_570[0].obj = local_278;
  cv::erode();
  SStack_708.width = 0;
  SStack_708.height = 0;
  local_718._0_4_ = 0x1010000;
  pvStack_710 = local_2d8;
  local_570[0].sz.width = 0;
  local_570[0].sz.height = 0;
  local_570[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray.flags = 0x2010000;
  local_798[0].super__InputArray.obj = local_338;
  local_570[0].obj = local_278;
  cv::addWeighted((_InputArray *)local_718,0.5,local_570,0.5,0.0,local_798,-1);
  local_718 = (undefined1  [8])&SStack_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"result/lady_trimap1.jpg","");
  local_570[0].sz.width = 0;
  local_570[0].sz.height = 0;
  local_570[0].flags = 0x1010000;
  local_798[0].super__InputArray.sz.width = 0;
  local_798[0].super__InputArray.sz.height = 0;
  local_798[0].super__InputArray._0_8_ = (void *)0x0;
  local_798[0].super__InputArray.obj = (void *)0x0;
  local_570[0].obj = local_338;
  cv::imwrite((string *)local_718,local_570,(vector *)local_798);
  if ((void *)local_798[0].super__InputArray._0_8_ != (void *)0x0) {
    operator_delete((void *)local_798[0].super__InputArray._0_8_,
                    (long)local_798[0].super__InputArray.sz - local_798[0].super__InputArray._0_8_);
  }
  if (local_718 != (undefined1  [8])&SStack_708) {
    operator_delete((void *)local_718,(long)SStack_708 + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  SharedMatting::SharedMatting((SharedMatting *)local_718);
  SharedMatting::loadImage((SharedMatting *)local_718,"input/lady1.jpg");
  SharedMatting::loadTrimap((SharedMatting *)local_718,"result/lady_trimap1.jpg");
  SharedMatting::solveAlpha((SharedMatting *)local_718);
  SharedMatting::save((SharedMatting *)local_718,"result/lady_alpha1.jpg");
  ppiVar3 = SharedMatting::alpha_return((SharedMatting *)local_718);
  pSVar1 = &local_798[0].super__InputArray.sz;
  local_798[0].super__InputArray._0_8_ = pSVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_798,"background/background.jpg","");
  cv::imread((string *)local_570,(int)local_798);
  if ((Size *)local_798[0].super__InputArray._0_8_ != pSVar1) {
    operator_delete((void *)local_798[0].super__InputArray._0_8_,
                    (long)local_798[0].super__InputArray.sz + 1);
  }
  local_7d8 = local_7c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"result/lady_alpha1.jpg","");
  cv::imread((string *)local_798,(int)&local_7d8);
  if (local_7d8 != local_7c8) {
    operator_delete(local_7d8,local_7c8[0] + 1);
  }
  local_7c8[0] = 0;
  local_7d8 = (long *)CONCAT44(local_7d8._4_4_,0x1010000);
  local_730.sz.width = 0;
  local_730.sz.height = 0;
  local_730.flags = 0x2010000;
  local_4f8 = 0xa0000000a;
  local_500 = 0xffffffffffffffff;
  local_7d0 = (_InputArray *)local_798;
  local_730.obj = (string *)local_798;
  cv::boxFilter(&local_7d8,&local_730,0xffffffff,&local_4f8,&local_500,1,4);
  local_7d8 = local_7c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"result/lady_alpha1.jpg","");
  local_730.sz.width = 0;
  local_730.sz.height = 0;
  local_730.flags = 0x1010000;
  local_7a8 = 0;
  local_7b8 = (void *)0x0;
  uStack_7b0 = 0;
  local_730.obj = (string *)local_798;
  cv::imwrite((string *)&local_7d8,&local_730,(vector *)&local_7b8);
  if (local_7b8 != (void *)0x0) {
    operator_delete(local_7b8,local_7a8 - (long)local_7b8);
  }
  if (local_7d8 != local_7c8) {
    operator_delete(local_7d8,local_7c8[0] + 1);
  }
  lVar10 = (long)local_460;
  if (0 < lVar10) {
    lVar5 = 0;
    do {
      if (0 < (int)local_45c) {
        pbVar7 = (byte *)(*local_750 * lVar5 + (long)local_798[0].super__InputArray.sz);
        piVar2 = ppiVar3[lVar5];
        uVar9 = 0;
        do {
          piVar2[uVar9] = (uint)*pbVar7;
          uVar9 = uVar9 + 1;
          pbVar7 = pbVar7 + 3;
        } while (local_45c != uVar9);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar10);
  }
  local_7c8[0] = 0;
  local_7d8 = (long *)CONCAT44(local_7d8._4_4_,0x1010000);
  local_730.sz.width = 0;
  local_730.sz.height = 0;
  local_730.flags = 0x2010000;
  local_508 = *local_428 << 0x20 | *local_428 >> 0x20;
  local_7d0 = local_570;
  local_730.obj = local_570;
  cv::resize(0,0);
  if (0 < local_460) {
    lVar5 = 0;
    do {
      if (0 < (int)local_45c) {
        lVar4 = *local_528 * lVar5 + (long)local_570[0].sz;
        lVar6 = *local_420 * lVar5 + local_458;
        lVar8 = 2;
        uVar9 = 0;
        do {
          *(char *)(lVar6 + -2 + lVar8) =
               (char)(int)((1.0 - (double)ppiVar3[lVar5][uVar9] / 255.0) *
                           (double)*(byte *)(lVar4 + -2 + lVar8) +
                          ((double)*(byte *)(lVar6 + -2 + lVar8) * (double)ppiVar3[lVar5][uVar9]) /
                          255.0);
          *(char *)(lVar6 + -1 + lVar8) =
               (char)(int)((1.0 - (double)ppiVar3[lVar5][uVar9] / 255.0) *
                           (double)*(byte *)(lVar4 + -1 + lVar8) +
                          ((double)*(byte *)(lVar6 + -1 + lVar8) * (double)ppiVar3[lVar5][uVar9]) /
                          255.0);
          *(char *)(lVar6 + lVar8) =
               (char)(int)((1.0 - (double)ppiVar3[lVar5][uVar9] / 255.0) *
                           (double)*(byte *)(lVar4 + lVar8) +
                          ((double)*(byte *)(lVar6 + lVar8) * (double)ppiVar3[lVar5][uVar9]) / 255.0
                          );
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 3;
        } while (local_45c != uVar9);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar10);
  }
  local_7d8 = local_7c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"result/lady_result1.jpg","")
  ;
  local_730.sz.width = 0;
  local_730.sz.height = 0;
  local_730.flags = 0x1010000;
  local_7a8 = 0;
  local_7b8 = (void *)0x0;
  uStack_7b0 = 0;
  local_730.obj = local_468;
  cv::imwrite((string *)&local_7d8,&local_730,(vector *)&local_7b8);
  if (local_7b8 != (void *)0x0) {
    operator_delete(local_7b8,local_7a8 - (long)local_7b8);
  }
  if (local_7d8 != local_7c8) {
    operator_delete(local_7d8,local_7c8[0] + 1);
  }
  local_7c8[0] = 0;
  local_7d8 = (long *)CONCAT44(local_7d8._4_4_,0x1010000);
  local_730.sz.width = 0;
  local_730.sz.height = 0;
  local_730.flags = 0x2010000;
  local_510 = *local_428 << 0x20 | *local_428 >> 0x20;
  local_7d0 = (_InputArray *)local_468;
  local_730.obj = local_468;
  cv::resize(0,0);
  local_7d8 = local_7c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"result","");
  local_730.sz.width = 0;
  local_730.sz.height = 0;
  local_730.flags = 0x1010000;
  local_730.obj = local_468;
  cv::imshow((string *)&local_7d8,&local_730);
  if (local_7d8 != local_7c8) {
    operator_delete(local_7d8,local_7c8[0] + 1);
  }
  cv::waitKey(0);
  cv::Mat::~Mat((Mat *)local_798);
  cv::Mat::~Mat((Mat *)local_570);
  SharedMatting::~SharedMatting((SharedMatting *)local_718);
  cv::Mat::~Mat((Mat *)local_398);
  cv::Mat::~Mat((Mat *)local_408);
  cv::Mat::~Mat(local_338);
  cv::Mat::~Mat(local_2d8);
  cv::Mat::~Mat(local_278);
  cv::Mat::~Mat(local_1b0);
  cv::Mat::~Mat(local_150);
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat(local_90);
  cv::Mat::~Mat((Mat *)local_468);
  return 0;
}

Assistant:

int main()
{
	Mat src = imread("input/lady1.jpg");
	Mat out, can1,can2, can, ero, dil,trimap;
	boxFilter(src, out, -1, Size(10, 10));
	Canny(out, can1, 36, 36, 3);
       
	Rect ccomp;
	floodFill(out, Point(10, 10), Scalar(0, 0, 0), &ccomp, Scalar(3, 3, 3), Scalar(3, 3, 3));
	Canny(out, can2, 15, 15, 3);
	addWeighted(can1, 1.0, can2, 1.0, 0.0, can);

	/*floodFill(out, Point(10, 10), Scalar(0, 0, 0), &ccomp, Scalar(3, 3, 3), Scalar(3, 3, 3));
	floodFill(out, Point(1963, 2400), Scalar(0, 0, 0), &ccomp, Scalar(3, 3, 3), Scalar(3, 3, 3));*/
    Mat element = getStructuringElement(MORPH_ELLIPSE, Size(35, 35));
	Mat element_e = getStructuringElement(MORPH_ELLIPSE, Size(50, 50));
	dilate(can, dil, element_e);
	dilate(dil, dil, element_e);
	dilate(dil, dil, element);
	dilate(dil, dil, element);
	erode(dil, ero, element_e);
	erode(ero, ero, element_e);
	erode(ero, ero, element_e);
	erode(ero, ero, element_e);
	erode(ero, ero, element);
    erode(ero, ero, element);
	//cvtColor(out, g_grayImage, CV_RGB2GRAY);
	//threshold(g_grayImage, g_dstImage, g_nThresholdValue, 255, g_nThresholdType);
	addWeighted(dil,0.5,ero,0.5,0.0,trimap);
	//imwrite("dil.jpg", dil);
	//imwrite("ero.jpg", ero);
	imwrite("result/lady_trimap1.jpg", trimap);
	cout << "ok" << endl; 

        SharedMatting sm;
        sm.loadImage("input/lady1.jpg");
        sm.loadTrimap("result/lady_trimap1.jpg");
        sm.solveAlpha();
        sm.save("result/lady_alpha1.jpg");
        int ** alpha = sm.alpha_return();
        Mat b_k = imread("background/background.jpg");
        Mat alp = imread("result/lady_alpha1.jpg");
        boxFilter(alp, alp, -1, Size(10, 10));
        imwrite("result/lady_alpha1.jpg", alp);
        int src_row = src.rows;
        int src_col = src.cols;
        int i,j;
       for (i=0; i<src_row ;i++) 
        {
          
           for (j=0; j<src_col; j++)
           {
              alpha[i][j] = double (alp.at<Vec3b>(i,j)[0]); 
           }
        }
    
        resize(b_k, b_k, src.size());

        for (i=0; i<src_row ;i++) 
        {
           uchar* data_s = src.ptr<uchar>(i);
           uchar* data_b = b_k.ptr<uchar>(i);
           uchar* data_a = alp.ptr<uchar>(i);
           for (j=0; j<src_col; j++)
           {
              data_s[3*j] = uchar(double(data_s[3*j]) * double(alpha[i][j])/255.0 + double(data_b[3*j]) * (1.0 - double(alpha[i][j])/255.0)); 
             data_s[3*j+1] = uchar(double(data_s[3*j+1]) * double(alpha[i][j])/255.0 + double(data_b[3*j+1]) * (1.0 - double(alpha[i][j])/255.0)); 
             data_s[3*j+2] = uchar(double(data_s[3*j+2]) * double(alpha[i][j])/255.0 + double(data_b[3*j+2]) * (1.0 - double(alpha[i][j])/255.0)); 
           }
        }
        imwrite("result/lady_result1.jpg", src);
        resize(src, src, src.size());
        imshow("result",src);
        waitKey(0);
    return 0;
}